

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
               (CodedInputStream *input,double *value)

{
  bool bVar1;
  double dVar2;
  uint64_t local_28;
  uint64_t temp;
  double *value_local;
  CodedInputStream *input_local;
  
  temp = (uint64_t)value;
  value_local = (double *)input;
  bVar1 = io::CodedInputStream::ReadLittleEndian64(input,&local_28);
  if (bVar1) {
    dVar2 = DecodeDouble(local_28);
    *(double *)temp = dVar2;
  }
  return bVar1;
}

Assistant:

inline bool WireFormatLite::ReadPrimitive<double, WireFormatLite::TYPE_DOUBLE>(
    io::CodedInputStream* input, double* value) {
  uint64_t temp;
  if (!input->ReadLittleEndian64(&temp)) return false;
  *value = DecodeDouble(temp);
  return true;
}